

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O0

void __thiscall
Assimp::LWO::AnimResolver::DoInterpolation2
          (AnimResolver *this,const_iterator beg,const_iterator end,double time,float *fill)

{
  float fVar1;
  float fVar2;
  float fVar3;
  reference pKVar4;
  double dVar5;
  double duration;
  float *fill_local;
  double time_local;
  AnimResolver *this_local;
  const_iterator end_local;
  const_iterator beg_local;
  
  this_local = (AnimResolver *)end._M_current;
  end_local = beg;
  pKVar4 = __gnu_cxx::
           __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
           ::operator*((__normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                        *)&this_local);
  if (pKVar4->inter == IT_STEP) {
    pKVar4 = __gnu_cxx::
             __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
             ::operator*(&end_local);
    *fill = pKVar4->value;
  }
  else {
    pKVar4 = __gnu_cxx::
             __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
             ::operator*((__normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                          *)&this_local);
    dVar5 = pKVar4->time;
    pKVar4 = __gnu_cxx::
             __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
             ::operator*(&end_local);
    dVar5 = dVar5 - pKVar4->time;
    if (dVar5 <= 0.0) {
      pKVar4 = __gnu_cxx::
               __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
               ::operator*(&end_local);
      *fill = pKVar4->value;
    }
    else {
      pKVar4 = __gnu_cxx::
               __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
               ::operator*(&end_local);
      fVar1 = pKVar4->value;
      pKVar4 = __gnu_cxx::
               __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
               ::operator*((__normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                            *)&this_local);
      fVar2 = pKVar4->value;
      pKVar4 = __gnu_cxx::
               __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
               ::operator*(&end_local);
      fVar3 = pKVar4->value;
      pKVar4 = __gnu_cxx::
               __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
               ::operator*(&end_local);
      *fill = (fVar2 - fVar3) * (float)((time - pKVar4->time) / dVar5) + fVar1;
    }
  }
  return;
}

Assistant:

void AnimResolver::DoInterpolation2(std::vector<LWO::Key>::const_iterator beg,
    std::vector<LWO::Key>::const_iterator end,double time, float& fill)
{
    switch ((*end).inter) {

        case LWO::IT_STEP:
            // no interpolation at all - take the value of the last key
            fill = (*beg).value;
            return;
        default:

            // silence compiler warning
            break;
    }
    // linear interpolation - default
    double duration = (*end).time - (*beg).time;
    if (duration > 0.0) {
        fill = (*beg).value + ((*end).value - (*beg).value)*(float)(((time - (*beg).time) / duration));
    } else {
        fill = (*beg).value;
    }
}